

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamer.cpp
# Opt level: O0

void __thiscall
streamer::Streamer::stream_frame(Streamer *this,uint8_t *data,int64_t frame_duration)

{
  AVFrame *pAVar1;
  bool bVar2;
  int local_24;
  int64_t iStack_20;
  int stride [1];
  int64_t frame_duration_local;
  uint8_t *data_local;
  Streamer *this_local;
  
  iStack_20 = frame_duration;
  frame_duration_local = (int64_t)data;
  data_local = &this->network_init_ok;
  bVar2 = can_stream(this);
  if (bVar2) {
    local_24 = (this->config).src_width * 3;
    sws_scale((this->scaler).ctx,&frame_duration_local,&local_24,0,(this->config).src_height,
              (this->picture).frame,((this->picture).frame)->linesize);
    pAVar1 = (this->picture).frame;
    pAVar1->pts = iStack_20 + pAVar1->pts;
    encode_and_write_frame(this->out_codec_ctx,this->format_ctx,(this->picture).frame);
  }
  return;
}

Assistant:

void Streamer::stream_frame(const uint8_t *data, int64_t frame_duration)
{
    if(can_stream()) {
        const int stride[] = {static_cast<int>(config.src_width*3)};
        sws_scale(scaler.ctx, &data, stride, 0, config.src_height, picture.frame->data, picture.frame->linesize);
        picture.frame->pts += frame_duration; //time of frame in milliseconds
        encode_and_write_frame(out_codec_ctx, format_ctx, picture.frame);
    }
}